

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_util.hpp
# Opt level: O2

bool units::detail::divides_overflows(unit_data *a,unit_data *b)

{
  bool bVar1;
  
  bVar1 = base_access<0>::minus_overflows<units::detail::unit_data>(a,b);
  if (!bVar1) {
    bVar1 = base_access<1>::minus_overflows<units::detail::unit_data>(a,b);
    if (!bVar1) {
      bVar1 = base_access<2>::minus_overflows<units::detail::unit_data>(a,b);
      if (!bVar1) {
        bVar1 = base_access<3>::minus_overflows<units::detail::unit_data>(a,b);
        if (!bVar1) {
          bVar1 = base_access<4>::minus_overflows<units::detail::unit_data>(a,b);
          if (!bVar1) {
            bVar1 = base_access<5>::minus_overflows<units::detail::unit_data>(a,b);
            if (!bVar1) {
              bVar1 = base_access<6>::minus_overflows<units::detail::unit_data>(a,b);
              if (!bVar1) {
                bVar1 = base_access<7>::minus_overflows<units::detail::unit_data>(a,b);
                if (!bVar1) {
                  bVar1 = base_access<8>::minus_overflows<units::detail::unit_data>(a,b);
                  if (!bVar1) {
                    bVar1 = base_access<9>::minus_overflows<units::detail::unit_data>(a,b);
                    return bVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

constexpr bool divides_overflows(const unit_data& a, const unit_data& b)
    {
        return (
            base_access<0>::minus_overflows(a, b) ||
            base_access<1>::minus_overflows(a, b) ||
            base_access<2>::minus_overflows(a, b) ||
            base_access<3>::minus_overflows(a, b) ||
            base_access<4>::minus_overflows(a, b) ||
            base_access<5>::minus_overflows(a, b) ||
            base_access<6>::minus_overflows(a, b) ||
            base_access<7>::minus_overflows(a, b) ||
            base_access<8>::minus_overflows(a, b) ||
            base_access<9>::minus_overflows(a, b));
    }